

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Uri.h
# Opt level: O0

void __thiscall
Uri::Uri::Uri(Uri *this,string *scheme,string *authority,string *path,string *query,string *fragment
             )

{
  string *fragment_local;
  string *query_local;
  string *path_local;
  string *authority_local;
  string *scheme_local;
  Uri *this_local;
  
  std::__cxx11::string::string((string *)this);
  std::__cxx11::string::string((string *)&this->scheme,(string *)scheme);
  std::__cxx11::string::string((string *)&this->authority,(string *)authority);
  std::__cxx11::string::string((string *)&this->path,(string *)path);
  std::__cxx11::string::string((string *)&this->query,(string *)query);
  std::__cxx11::string::string((string *)&this->fragment,(string *)fragment);
  return;
}

Assistant:

Uri (string &scheme, string &authority, string &path, string &query, string &fragment)
            : scheme(scheme), authority(authority), path(path), query(query), fragment(fragment) {}